

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ignorm.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  string *this;
  _Alloc_hider _Var6;
  int iVar7;
  char *__s;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  int num_order;
  double gamma;
  GeneralizedCepstrumInverseGainNormalization generalized_cepstrum_inverse_gain_normalization;
  vector<double,_std::allocator<double>_> generalized_cepstrum;
  ostringstream error_message_5;
  ifstream ifs;
  int local_414;
  double local_410;
  string local_408;
  undefined1 local_3e8 [32];
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_414 = 0x19;
  local_410 = 0.0;
  iVar7 = 0;
  do {
    iVar3 = ya_getopt_long(argc,argv,"m:g:c:h",(option *)0x0,(int *)0x0);
    if (iVar3 < 0x67) {
      iVar5 = 2;
      if (iVar3 != -1) {
        if (iVar3 == 99) {
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
          bVar10 = sptk::ConvertStringToInteger(&local_238,(int *)local_3e8);
          bVar1 = (int)local_3e8._0_4_ < 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (!bVar10 || bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,
                       "The argument for the -c option must be a positive integer",0x39);
            local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ignorm","");
            sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
            goto LAB_001039f3;
          }
          local_410 = -1.0 / (double)(int)local_3e8._0_4_;
LAB_001038a1:
          iVar5 = 0;
        }
        else {
LAB_0010391d:
          anon_unknown.dwarf_2bd3::PrintUsage((ostream *)&std::cerr);
          iVar5 = 1;
          iVar7 = 1;
        }
      }
    }
    else {
      if (iVar3 == 0x67) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar1 = sptk::ConvertStringToDouble(&local_238,&local_410);
        if (bVar1) {
          bVar1 = sptk::IsValidGamma(local_410);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (bVar1) {
            iVar5 = 0;
            goto LAB_00103a30;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -g option must be in [-1.0, 1.0]",
                   0x35);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ignorm","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      }
      else {
        if (iVar3 == 0x68) {
          anon_unknown.dwarf_2bd3::PrintUsage((ostream *)&std::cout);
          iVar7 = 0;
          iVar5 = 1;
          goto LAB_00103a30;
        }
        if (iVar3 != 0x6d) goto LAB_0010391d;
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar1 = sptk::ConvertStringToInteger(&local_238,&local_414);
        bVar10 = -1 < local_414;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar1 && bVar10) goto LAB_001038a1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ignorm","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      }
LAB_001039f3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar5 = 1;
      iVar7 = 1;
    }
LAB_00103a30:
  } while (iVar5 == 0);
  if (iVar5 != 2) {
    return iVar7;
  }
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      __s = (char *)0x0;
    }
    else {
      __s = argv[ya_optind];
    }
    bVar1 = sptk::SetBinaryMode();
    this = &local_238;
    if (bVar1) {
      std::ifstream::ifstream(this);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (string *)&std::cin;
        }
        sptk::GeneralizedCepstrumInverseGainNormalization::
        GeneralizedCepstrumInverseGainNormalization
                  ((GeneralizedCepstrumInverseGainNormalization *)local_3e8,local_414,local_410);
        if (local_3e8[0x18] != '\0') {
          lVar8 = (long)local_414;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_3c8,lVar8 + 1U,(allocator_type *)local_3b0);
          do {
            iVar7 = (int)(lVar8 + 1U);
            bVar1 = sptk::ReadStream<double>(false,0,0,iVar7,&local_3c8,(istream *)this,(int *)0x0);
            if (!bVar1) {
              iVar7 = 0;
              goto LAB_00103e39;
            }
            bVar1 = sptk::GeneralizedCepstrumInverseGainNormalization::Run
                              ((GeneralizedCepstrumInverseGainNormalization *)local_3e8,&local_3c8);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"Failed to denormalize generalized cepstrum",0x2a);
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"ignorm","");
              sptk::PrintErrorMessage(&local_408,(ostringstream *)local_3b0);
              goto LAB_00103e06;
            }
            bVar1 = sptk::WriteStream<double>(0,iVar7,&local_3c8,(ostream *)&std::cout,(int *)0x0);
          } while (bVar1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Failed to write generalized cepstrum",0x24);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"ignorm","");
          sptk::PrintErrorMessage(&local_408,(ostringstream *)local_3b0);
LAB_00103e06:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
          iVar7 = 1;
LAB_00103e39:
          if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          goto LAB_00103e48;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,
                   "Failed to initialize GeneralizedCepstrumInverseGainNormalization",0x40);
        paVar9 = &local_408.field_2;
        local_408._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"ignorm","");
        sptk::PrintErrorMessage(&local_408,(ostringstream *)local_3b0);
        _Var6._M_p = local_408._M_dataplus._M_p;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Cannot open file ",0x11);
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar4);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_3e8 + 0x10);
        local_3e8._0_8_ = paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"ignorm","");
        sptk::PrintErrorMessage((string *)local_3e8,(ostringstream *)local_3b0);
        _Var6._M_p = (pointer)local_3e8._0_8_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != paVar9) {
        operator_delete(_Var6._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar7 = 1;
LAB_00103e48:
      std::ifstream::~ifstream(&local_238);
      return iVar7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ignorm","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p == &local_3b0[0].field_2) goto LAB_00103ac0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"ignorm","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p == &local_3b0[0].field_2) goto LAB_00103ac0;
  }
  operator_delete(local_3b0[0]._M_dataplus._M_p);
LAB_00103ac0:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double gamma(kDefaultGamma);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:g:c:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("ignorm", error_message);
          return 1;
        }
        gamma = -1.0 / tmp;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::GeneralizedCepstrumInverseGainNormalization
      generalized_cepstrum_inverse_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_inverse_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize GeneralizedCepstrumInverseGainNormalization";
    sptk::PrintErrorMessage("ignorm", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> generalized_cepstrum(length);

  while (sptk::ReadStream(false, 0, 0, length, &generalized_cepstrum,
                          &input_stream, NULL)) {
    if (!generalized_cepstrum_inverse_gain_normalization.Run(
            &generalized_cepstrum)) {
      std::ostringstream error_message;
      error_message << "Failed to denormalize generalized cepstrum";
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, generalized_cepstrum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write generalized cepstrum";
      sptk::PrintErrorMessage("ignorm", error_message);
      return 1;
    }
  }

  return 0;
}